

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int ChooseLeaf(Rtree *pRtree,RtreeCell *pCell,int iHeight,RtreeNode **ppLeaf)

{
  RtreeNode *pNode;
  bool bVar1;
  ushort uVar2;
  int iVar3;
  RtreeNode *pParent;
  int iVar4;
  uint uVar5;
  long in_FS_OFFSET;
  RtreeDValue RVar6;
  RtreeDValue RVar7;
  double dVar8;
  double dVar9;
  RtreeNode *pChild;
  RtreeCell cell;
  double local_c0;
  undefined1 *local_b0;
  RtreeNode *local_78;
  RtreeNode *local_70;
  RtreeCell local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = (RtreeNode *)0x0;
  iVar3 = nodeAcquire(pRtree,1,(RtreeNode *)0x0,&local_70);
  pParent = local_70;
  if (iVar3 == 0) {
    iVar4 = 0;
    do {
      if (pRtree->iDepth - iHeight <= iVar4) {
        iVar3 = 0;
        break;
      }
      pNode = (RtreeNode *)pParent->zData;
      uVar2 = *(ushort *)((long)&pNode->pParent + 2);
      uVar2 = uVar2 << 8 | uVar2 >> 8;
      local_78 = (RtreeNode *)0x0;
      if (uVar2 == 0) {
        local_b0 = (undefined1 *)0x0;
      }
      else {
        bVar1 = false;
        local_c0 = 0.0;
        local_b0 = (undefined1 *)0x0;
        uVar5 = 0;
        do {
          local_68.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
          local_68.aCoord[4].i = -1;
          local_68.aCoord[5].i = -1;
          local_68.aCoord[6].i = -1;
          local_68.aCoord[7].i = -1;
          local_68.aCoord[0].i = -1;
          local_68.aCoord[1].i = -1;
          local_68.aCoord[2].i = -1;
          local_68.aCoord[3].i = -1;
          local_68.aCoord[8] = (RtreeCoord)0xffffffff;
          local_68.aCoord[9] = (RtreeCoord)0xffffffff;
          nodeGetCell(pRtree,pNode,uVar5,&local_68);
          iVar3 = cellContains(pRtree,&local_68,pCell);
          if (iVar3 != 0) {
            RVar6 = cellArea(pRtree,&local_68);
            if (RVar6 < local_c0 || !bVar1) {
              local_b0 = (undefined1 *)local_68.iRowid;
              local_c0 = RVar6;
            }
            bVar1 = true;
          }
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
        if (!bVar1) {
          uVar5 = 0;
          dVar9 = 0.0;
          do {
            local_68.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
            local_68.aCoord[4].i = -1;
            local_68.aCoord[5].i = -1;
            local_68.aCoord[6].i = -1;
            local_68.aCoord[7].i = -1;
            local_68.aCoord[0].i = -1;
            local_68.aCoord[1].i = -1;
            local_68.aCoord[2].i = -1;
            local_68.aCoord[3].i = -1;
            local_68.aCoord[8] = (RtreeCoord)0xffffffff;
            local_68.aCoord[9] = (RtreeCoord)0xffffffff;
            nodeGetCell(pRtree,pNode,uVar5,&local_68);
            RVar6 = cellArea(pRtree,&local_68);
            cellUnion(pRtree,&local_68,pCell);
            RVar7 = cellArea(pRtree,&local_68);
            dVar8 = RVar7 - RVar6;
            if ((uVar5 == 0) || (dVar8 < dVar9)) {
LAB_001f92eb:
              local_b0 = (undefined1 *)local_68.iRowid;
              dVar9 = dVar8;
              local_c0 = RVar6;
            }
            else if ((dVar8 == dVar9) && ((!NAN(dVar8) && !NAN(dVar9) && (RVar6 < local_c0))))
            goto LAB_001f92eb;
            uVar5 = uVar5 + 1;
          } while (uVar2 != uVar5);
        }
      }
      iVar3 = nodeAcquire(pRtree,(i64)local_b0,pParent,&local_78);
      nodeRelease(pRtree,pParent);
      iVar4 = iVar4 + 1;
      pParent = local_78;
    } while (iVar3 == 0);
  }
  *ppLeaf = pParent;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int ChooseLeaf(
  Rtree *pRtree,               /* Rtree table */
  RtreeCell *pCell,            /* Cell to insert into rtree */
  int iHeight,                 /* Height of sub-tree rooted at pCell */
  RtreeNode **ppLeaf           /* OUT: Selected leaf page */
){
  int rc;
  int ii;
  RtreeNode *pNode = 0;
  rc = nodeAcquire(pRtree, 1, 0, &pNode);

  for(ii=0; rc==SQLITE_OK && ii<(pRtree->iDepth-iHeight); ii++){
    int iCell;
    sqlite3_int64 iBest = 0;
    int bFound = 0;
    RtreeDValue fMinGrowth = RTREE_ZERO;
    RtreeDValue fMinArea = RTREE_ZERO;
    int nCell = NCELL(pNode);
    RtreeNode *pChild = 0;

    /* First check to see if there is are any cells in pNode that completely
    ** contains pCell.  If two or more cells in pNode completely contain pCell
    ** then pick the smallest.
    */
    for(iCell=0; iCell<nCell; iCell++){
      RtreeCell cell;
      nodeGetCell(pRtree, pNode, iCell, &cell);
      if( cellContains(pRtree, &cell, pCell) ){
        RtreeDValue area = cellArea(pRtree, &cell);
        if( bFound==0 || area<fMinArea ){
          iBest = cell.iRowid;
          fMinArea = area;
          bFound = 1;
        }
      }
    }
    if( !bFound ){
      /* No cells of pNode will completely contain pCell.  So pick the
      ** cell of pNode that grows by the least amount when pCell is added.
      ** Break ties by selecting the smaller cell.
      */
      for(iCell=0; iCell<nCell; iCell++){
        RtreeCell cell;
        RtreeDValue growth;
        RtreeDValue area;
        nodeGetCell(pRtree, pNode, iCell, &cell);
        area = cellArea(pRtree, &cell);
        cellUnion(pRtree, &cell, pCell);
        growth = cellArea(pRtree, &cell)-area;
        if( iCell==0
         || growth<fMinGrowth
         || (growth==fMinGrowth && area<fMinArea)
        ){
          fMinGrowth = growth;
          fMinArea = area;
          iBest = cell.iRowid;
        }
      }
    }

    rc = nodeAcquire(pRtree, iBest, pNode, &pChild);
    nodeRelease(pRtree, pNode);
    pNode = pChild;
  }

  *ppLeaf = pNode;
  return rc;
}